

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_props.cpp
# Opt level: O1

UBool icu_63::UnicodeSet::resemblesPropertyPattern(UnicodeString *pattern,int32_t pos)

{
  short sVar1;
  char16_t *pcVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  
  sVar1 = (pattern->fUnion).fStackFields.fLengthAndFlags;
  uVar4 = (uint)sVar1;
  if (sVar1 < 0) {
    uVar3 = *(uint *)((long)&pattern->fUnion + 4);
  }
  else {
    uVar3 = (int)uVar4 >> 5;
  }
  if ((int)uVar3 < pos + 5) {
    return '\0';
  }
  if ((uint)pos < uVar3) {
    if ((uVar4 & 2) == 0) {
      pcVar2 = (pattern->fUnion).fFields.fArray;
    }
    else {
      pcVar2 = (char16_t *)((long)&pattern->fUnion + 2);
    }
    if (((pcVar2[pos] == L'[') && (pos + 1U < uVar3)) && (pcVar2[(int)(pos + 1U)] == L':')) {
      return '\x01';
    }
    if ((uint)pos < uVar3) {
      if ((uVar4 & 2) == 0) {
        pcVar2 = (pattern->fUnion).fFields.fArray;
      }
      else {
        pcVar2 = (char16_t *)((long)&pattern->fUnion + 2);
      }
      if ((pcVar2[pos] == L'\\') && (pos + 1U < uVar3)) {
        bVar5 = (pcVar2[(int)(pos + 1U)] & 0xffdfU) == 0x50;
        goto LAB_002c6567;
      }
    }
  }
  bVar5 = false;
LAB_002c6567:
  if (uVar3 <= (uint)pos) {
    return bVar5;
  }
  if (bVar5 == false) {
    if ((uVar4 & 2) == 0) {
      pcVar2 = (pattern->fUnion).fFields.fArray;
    }
    else {
      pcVar2 = (char16_t *)((long)&pattern->fUnion + 2);
    }
    if ((pcVar2[pos] == L'\\') && (pos + 1U < uVar3)) {
      return pcVar2[(int)(pos + 1U)] == L'N';
    }
    return '\0';
  }
  return bVar5;
}

Assistant:

UBool UnicodeSet::resemblesPropertyPattern(const UnicodeString& pattern,
                                           int32_t pos) {
    // Patterns are at least 5 characters long
    if ((pos+5) > pattern.length()) {
        return FALSE;
    }

    // Look for an opening [:, [:^, \p, or \P
    return isPOSIXOpen(pattern, pos) || isPerlOpen(pattern, pos) || isNameOpen(pattern, pos);
}